

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SolveBeforeConstraintSyntax *pSVar1;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *in_stack_00000100;
  
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SolveBeforeConstraintSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SolveBeforeConstraintSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SolveBeforeConstraintSyntax>(
        node.solve.deepClone(alloc),
        *deepClone(node.beforeExpr, alloc),
        node.before.deepClone(alloc),
        *deepClone(node.afterExpr, alloc),
        node.semi.deepClone(alloc)
    );
}